

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

void POOL_add_internal(POOL_ctx *ctx,POOL_function function,void *opaque)

{
  undefined8 *puVar1;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  POOL_job job;
  
  if (*(int *)(in_RDI + 0xe8) == 0) {
    *(undefined4 *)(in_RDI + 0x58) = 0;
    puVar1 = (undefined8 *)(*(long *)(in_RDI + 0x30) + *(long *)(in_RDI + 0x40) * 0x10);
    *puVar1 = in_RSI;
    puVar1[1] = in_RDX;
    *(ulong *)(in_RDI + 0x40) = (*(long *)(in_RDI + 0x40) + 1U) % *(ulong *)(in_RDI + 0x48);
    pthread_cond_signal((pthread_cond_t *)(in_RDI + 0xb8));
  }
  return;
}

Assistant:

static void
POOL_add_internal(POOL_ctx* ctx, POOL_function function, void *opaque)
{
    POOL_job job;
    job.function = function;
    job.opaque = opaque;
    assert(ctx != NULL);
    if (ctx->shutdown) return;

    ctx->queueEmpty = 0;
    ctx->queue[ctx->queueTail] = job;
    ctx->queueTail = (ctx->queueTail + 1) % ctx->queueSize;
    ZSTD_pthread_cond_signal(&ctx->queuePopCond);
}